

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcollator.cpp
# Opt level: O0

int QCollator::defaultCompare(QStringView s1,QStringView s2)

{
  long lVar1;
  int iVar2;
  QCollator *in_RSI;
  long in_FS_OFFSET;
  QStringView in_stack_00000000;
  QStringView in_stack_00000010;
  GenerationalCollator *in_stack_ffffffffffffffc0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_defaultCollator>_>::operator->
            ((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_defaultCollator>_> *
             )0x4c21d6);
  QThreadStorage<(anonymous_namespace)::GenerationalCollator>::localData
            ((QThreadStorage<(anonymous_namespace)::GenerationalCollator> *)0x4c21de);
  anon_unknown.dwarf_a1291b::GenerationalCollator::collator(in_stack_ffffffffffffffc0);
  iVar2 = compare(in_RSI,in_stack_00000010,in_stack_00000000);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

int QCollator::defaultCompare(QStringView s1, QStringView s2)
{
    return defaultCollator->localData().collator().compare(s1, s2);
}